

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O1

VariableParameter *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  VariableParameter *pVVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0x233308;
  if (m_mDecoders._16_8_ != 0) {
    lVar2 = 0x233308;
    lVar3 = m_mDecoders._16_8_;
    do {
      if (EnumVal <= *(int *)(lVar3 + 0x20)) {
        lVar2 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(int *)(lVar3 + 0x20) < EnumVal) * 8);
    } while (lVar3 != 0);
  }
  lVar3 = 0x233308;
  if ((lVar2 != 0x233308) && (lVar3 = 0x233308, *(int *)(lVar2 + 0x20) <= EnumVal)) {
    lVar3 = lVar2;
  }
  if (lVar3 != 0x233308) {
    pVVar1 = (VariableParameter *)
             (**(code **)(**(long **)(lVar3 + 0x30) + 0x10))
                       (*(long **)(lVar3 + 0x30),EnumVal,stream);
    return pVVar1;
  }
  return (VariableParameter *)0x0;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}